

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlDocPtr pxVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlChar *pxVar12;
  xmlEntityPtr pxVar13;
  xmlChar *pxVar14;
  xmlBufferPtr pxVar15;
  xmlDocPtr pxVar16;
  long lVar17;
  uint uVar18;
  int nr;
  int nr_00;
  int nr_01;
  int extraout_EDX;
  int nr_02;
  int nr_03;
  int nr_04;
  bool bVar19;
  int n_buf;
  int iVar20;
  uint uVar21;
  xmlDocPtr in_RSI;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  int n_doc;
  uint uVar25;
  undefined1 auVar26 [12];
  int local_64;
  uint local_60;
  int test_ret;
  uint local_58;
  int test_ret_1;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing entities : 12 of 16 functions ...");
  }
  test_ret_1 = 0;
  for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
    for (uVar25 = 0; uVar25 != 5; uVar25 = uVar25 + 1) {
      for (iVar20 = 0; iVar20 != 4; iVar20 = iVar20 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
            for (uVar24 = 0; iVar4 = (int)in_RSI, uVar24 != 5; uVar24 = uVar24 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar9 = gen_xmlDocPtr(uVar21,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar25,iVar4);
              iVar3 = gen_int(iVar20,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar4);
              pxVar11 = gen_const_xmlChar_ptr(uVar18,iVar4);
              pxVar12 = gen_const_xmlChar_ptr(uVar24,iVar4);
              pxVar13 = (xmlEntityPtr)xmlAddDocEntity(pxVar9,in_RSI,iVar3,pxVar10,pxVar11,pxVar12);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar9,in_RSI,nr);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar4 - iVar2));
                test_ret_1 = test_ret_1 + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar25);
                printf(" %d",iVar20);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar18);
                in_RSI = (xmlDocPtr)(ulong)uVar24;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar20 = 0;
  for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
    for (uVar25 = 0; uVar25 != 5; uVar25 = uVar25 + 1) {
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
            for (uVar24 = 0; iVar2 = (int)in_RSI, uVar24 != 5; uVar24 = uVar24 + 1) {
              iVar3 = xmlMemBlocks();
              pxVar9 = gen_xmlDocPtr(uVar21,iVar2);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar25,iVar2);
              iVar5 = gen_int(iVar4,iVar2);
              pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar2);
              pxVar11 = gen_const_xmlChar_ptr(uVar18,iVar2);
              pxVar12 = gen_const_xmlChar_ptr(uVar24,iVar2);
              pxVar13 = (xmlEntityPtr)xmlAddDtdEntity(pxVar9,in_RSI,iVar5,pxVar10,pxVar11,pxVar12);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar9,in_RSI,nr_00);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar3 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar2 - iVar3));
                iVar20 = iVar20 + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d",(ulong)uVar25);
                printf(" %d",iVar4);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar18);
                in_RSI = (xmlDocPtr)(ulong)uVar24;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_38 = 0;
  for (local_58 = 0; local_58 != 4; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 != 4; local_60 = local_60 + 1) {
      for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
        uVar22 = 0;
        while (iVar2 = (int)uVar22, iVar2 != 4) {
          uVar23 = 0;
          while (iVar3 = (int)uVar23, iVar3 != 5) {
            for (uVar21 = 0; uVar21 != 5; uVar21 = uVar21 + 1) {
              for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
                bVar19 = true;
                while (iVar8 = (int)in_RSI, bVar19) {
                  iVar6 = xmlMemBlocks();
                  pxVar9 = gen_xmlDocPtr(local_58,iVar8);
                  uVar25 = gen_int(local_60,iVar8);
                  pxVar10 = gen_const_xmlChar_ptr(iVar4,iVar8);
                  iVar7 = gen_int(iVar2,iVar8);
                  pxVar11 = gen_const_xmlChar_ptr(iVar3,iVar8);
                  pxVar12 = gen_const_xmlChar_ptr(uVar21,iVar8);
                  pxVar14 = gen_const_xmlChar_ptr(iVar5,iVar8);
                  in_RSI = (xmlDocPtr)(ulong)uVar25;
                  xmlAddEntity(pxVar9,in_RSI,pxVar10,iVar7,pxVar11,pxVar12,pxVar14,0);
                  call_tests = call_tests + 1;
                  des_xmlDocPtr((int)pxVar9,in_RSI,nr_01);
                  xmlResetLastError();
                  iVar8 = xmlMemBlocks();
                  if (iVar6 == iVar8) break;
                  iVar8 = xmlMemBlocks();
                  bVar19 = false;
                  printf("Leak of %d blocks found in xmlAddEntity",(ulong)(uint)(iVar8 - iVar6));
                  local_38 = local_38 + 1;
                  printf(" %d",(ulong)local_58);
                  printf(" %d",(ulong)local_60);
                  printf(" %d",iVar4);
                  printf(" %d",uVar22);
                  printf(" %d",uVar23);
                  printf(" %d",(ulong)uVar21);
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
              }
            }
            uVar23 = (ulong)(iVar3 + 1);
          }
          uVar22 = (ulong)(iVar2 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar2 = 0;
  do {
    if (iVar4 == 3) {
      function_tests = function_tests + 1;
      iVar4 = 0;
      iVar3 = 0;
      do {
        if (iVar4 == 3) {
          function_tests = function_tests + 1;
          local_60 = 0;
          for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar4 = (int)in_RSI;
              iVar5 = (int)pxVar9;
              if (iVar5 == 5) break;
              iVar8 = xmlMemBlocks();
              pxVar16 = gen_xmlDocPtr(uVar21,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar4);
              auVar26 = xmlEncodeEntitiesReentrant(pxVar16);
              iVar4 = auVar26._8_4_;
              if (auVar26._0_8_ != 0) {
                (*_xmlFree)(auVar26._0_8_);
                iVar4 = extraout_EDX;
              }
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar16,in_RSI,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar8 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",
                       (ulong)(uint)(iVar4 - iVar8));
                local_60 = local_60 + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar5 + 1);
            }
          }
          function_tests = function_tests + 1;
          bVar19 = true;
          local_64 = 0;
          while (bVar19) {
            for (uVar21 = 0; iVar4 = (int)in_RSI, uVar21 != 5; uVar21 = uVar21 + 1) {
              iVar5 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar21,iVar4);
              lVar17 = xmlEncodeSpecialChars(0);
              if (lVar17 != 0) {
                (*_xmlFree)(lVar17);
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar5 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeSpecialChars",
                       (ulong)(uint)(iVar4 - iVar5));
                local_64 = local_64 + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
            bVar19 = false;
          }
          function_tests = function_tests + 1;
          bVar19 = true;
          test_ret = 0;
          while (bVar19) {
            for (uVar21 = 0; iVar4 = (int)in_RSI, uVar21 != 5; uVar21 = uVar21 + 1) {
              iVar5 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar21,iVar4);
              pxVar13 = (xmlEntityPtr)xmlGetDocEntity(0);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar5 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar4 - iVar5));
                test_ret = test_ret + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
            bVar19 = false;
          }
          iVar20 = iVar20 + test_ret_1 + local_38 + iVar2 + iVar3 + local_60;
          function_tests = function_tests + 1;
          local_60 = 0;
          for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar4 = (int)in_RSI;
              iVar2 = (int)pxVar9;
              if (iVar2 == 5) break;
              iVar3 = xmlMemBlocks();
              pxVar16 = gen_xmlDocPtr(uVar21,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar4);
              pxVar13 = (xmlEntityPtr)xmlGetDtdEntity(pxVar16);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar16,in_RSI,nr_02);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar4 - iVar3));
                local_60 = local_60 + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
            }
          }
          function_tests = function_tests + 1;
          local_38 = 0;
          for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
            pxVar9 = (xmlDocPtr)0x0;
            while( true ) {
              iVar4 = (int)in_RSI;
              iVar2 = (int)pxVar9;
              if (iVar2 == 5) break;
              iVar3 = xmlMemBlocks();
              pxVar16 = gen_xmlDocPtr(uVar21,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar4);
              pxVar13 = (xmlEntityPtr)xmlGetParameterEntity(pxVar16);
              desret_xmlEntityPtr(pxVar13);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar16,in_RSI,nr_03);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetParameterEntity",
                       (ulong)(uint)(iVar4 - iVar3));
                local_38 = local_38 + 1;
                printf(" %d",(ulong)uVar21);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar9;
              }
              pxVar9 = (xmlDocPtr)(ulong)(iVar2 + 1);
            }
          }
          function_tests = function_tests + 1;
          test_ret_1 = 0;
          for (uVar21 = 0; uVar21 != 5; uVar21 = uVar21 + 1) {
            iVar4 = xmlMemBlocks();
            pxVar10 = gen_const_xmlChar_ptr(uVar21,(int)in_RSI);
            pxVar13 = (xmlEntityPtr)xmlGetPredefinedEntity(pxVar10);
            desret_xmlEntityPtr(pxVar13);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar4 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlGetPredefinedEntity",
                     (ulong)(uint)(iVar2 - iVar4));
              test_ret_1 = test_ret_1 + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar21;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          local_34 = 0;
          for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
            for (uVar25 = 0; uVar25 != 5; uVar25 = uVar25 + 1) {
              for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
                for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
                  for (uVar18 = 0; uVar18 != 5; uVar18 = uVar18 + 1) {
                    for (uVar24 = 0; iVar2 = (int)in_RSI, uVar24 != 5; uVar24 = uVar24 + 1) {
                      iVar3 = xmlMemBlocks();
                      pxVar9 = gen_xmlDocPtr(uVar21,iVar2);
                      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar25,iVar2);
                      iVar5 = gen_int(iVar4,iVar2);
                      pxVar10 = gen_const_xmlChar_ptr(uVar1,iVar2);
                      pxVar11 = gen_const_xmlChar_ptr(uVar18,iVar2);
                      pxVar12 = gen_const_xmlChar_ptr(uVar24,iVar2);
                      pxVar13 = (xmlEntityPtr)
                                xmlNewEntity(pxVar9,in_RSI,iVar5,pxVar10,pxVar11,pxVar12);
                      desret_xmlEntityPtr(pxVar13);
                      call_tests = call_tests + 1;
                      des_xmlDocPtr((int)pxVar9,in_RSI,nr_04);
                      xmlResetLastError();
                      iVar2 = xmlMemBlocks();
                      if (iVar3 != iVar2) {
                        iVar2 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlNewEntity",
                               (ulong)(uint)(iVar2 - iVar3));
                        local_34 = local_34 + 1;
                        printf(" %d",(ulong)uVar21);
                        printf(" %d",(ulong)uVar25);
                        printf(" %d",iVar4);
                        printf(" %d",(ulong)uVar1);
                        printf(" %d",(ulong)uVar18);
                        in_RSI = (xmlDocPtr)(ulong)uVar24;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                  }
                }
              }
            }
          }
          function_tests = function_tests + 1;
          uVar21 = iVar20 + local_64 + test_ret + local_60 + local_38 + test_ret_1 + local_34;
          if (uVar21 != 0) {
            printf("Module entities: %d errors\n",(ulong)uVar21);
          }
          return uVar21;
        }
        bVar19 = true;
        while (iVar5 = (int)in_RSI, bVar19) {
          iVar8 = xmlMemBlocks();
          pxVar15 = gen_xmlBufferPtr(iVar4,iVar5);
          in_RSI = (xmlDocPtr)0x0;
          xmlDumpEntityDecl(pxVar15);
          call_tests = call_tests + 1;
          if (pxVar15 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar15);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar8 == iVar5) break;
          iVar5 = xmlMemBlocks();
          bVar19 = false;
          printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar5 - iVar8));
          iVar3 = iVar3 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
    bVar19 = true;
    while (iVar3 = (int)in_RSI, bVar19) {
      iVar5 = xmlMemBlocks();
      pxVar15 = gen_xmlBufferPtr(iVar4,iVar3);
      in_RSI = (xmlDocPtr)0x0;
      xmlDumpEntitiesTable(pxVar15);
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar15);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 == iVar3) break;
      iVar3 = xmlMemBlocks();
      bVar19 = false;
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar3 - iVar5));
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 12 of 16 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlAddEntity();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}